

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O2

uint8_t parse_memtm_mapping_entry_11(uint16_t pos,uint16_t len,uint16_t hdr_pos)

{
  uint8_t uVar1;
  
  if (len < 4) {
    printf("Unknown timing mapping entry length: %u\n",(ulong)len);
    uVar1 = 0xff;
  }
  else {
    if (bios->data[pos] == 0xff) {
      puts(" Timing entry: none/boot");
    }
    else {
      printf(" Timing entry: %u\n");
    }
    uVar1 = bios->data[pos];
  }
  return uVar1;
}

Assistant:

uint8_t parse_memtm_mapping_entry_11(uint16_t pos, uint16_t len, uint16_t hdr_pos)
{
	if(len < 4) {
		printf("Unknown timing mapping entry length: %u\n", len);
		return 0xff;
	}
	if(bios->data[pos+0] != 0xff) {
		printf(" Timing entry: %u\n", bios->data[pos]);
	} else {
		printf(" Timing entry: none/boot\n");
	}

	return bios->data[pos];
}